

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# econ.cpp
# Opt level: O0

int CEcon::DelClientCallback(int ClientID,char *pReason,void *pUser)

{
  IConsole *pIVar1;
  CEcon *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  CEcon *pThis;
  char aBuf [256];
  char aAddrStr [48];
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar2;
  undefined4 in_stack_fffffffffffffec0;
  NETADDR *in_stack_fffffffffffffec8;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CNetConsole::ClientAddr
            ((CNetConsole *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  uVar2 = 1;
  net_addr_str(in_stack_fffffffffffffec8,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffec0),
               (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  str_format(&stack0xfffffffffffffec8,0x100,"client dropped. cid=%d addr=%s reason=\'%s\'",
             (ulong)in_EDI,local_38,in_RSI);
  pIVar1 = Console(in_RDX);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])
            (pIVar1,(ulong)uVar2,"econ",&stack0xfffffffffffffec8,0);
  in_RDX->m_aClients[(int)in_EDI].m_State = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int CEcon::DelClientCallback(int ClientID, const char *pReason, void *pUser)
{
	CEcon *pThis = (CEcon *)pUser;

	char aAddrStr[NETADDR_MAXSTRSIZE];
	net_addr_str(pThis->m_NetConsole.ClientAddr(ClientID), aAddrStr, sizeof(aAddrStr), true);
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "client dropped. cid=%d addr=%s reason='%s'", ClientID, aAddrStr, pReason);
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "econ", aBuf);

	pThis->m_aClients[ClientID].m_State = CClient::STATE_EMPTY;
	return 0;
}